

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_test.c
# Opt level: O3

bool_t hexTest(void)

{
  bool_t bVar1;
  bool_t bVar2;
  int iVar3;
  octet *poVar4;
  bool_t bVar5;
  size_t count;
  octet buf [256];
  char hex1 [513];
  char hex [513];
  undefined1 auStack_548 [256];
  char local_448 [528];
  char local_238 [528];
  
  bVar1 = hexIsValid("1234");
  bVar5 = 0;
  bVar2 = 0;
  if ((((bVar1 != 0) && (bVar1 = hexIsValid("12345"), bVar2 = bVar5, bVar1 == 0)) &&
      (bVar1 = hexIsValid("ABCDEFabcdef"), bVar1 != 0)) &&
     (bVar1 = hexIsValid("abcdefgh"), bVar1 == 0)) {
    count = 0;
    do {
      poVar4 = beltH();
      hexFrom(local_238,poVar4,count);
      poVar4 = beltH();
      bVar2 = hexEq(poVar4,local_238);
      if (bVar2 == 0) {
        return 0;
      }
      hexTo(auStack_548,local_238);
      poVar4 = beltH();
      bVar2 = memEq(auStack_548,poVar4,count);
      if (bVar2 == 0) {
        return 0;
      }
      poVar4 = beltH();
      hexFromRev(local_238,poVar4,count);
      poVar4 = beltH();
      bVar2 = hexEqRev(poVar4,local_238);
      if (bVar2 == 0) {
        return 0;
      }
      hexToRev(auStack_548,local_238);
      poVar4 = beltH();
      bVar2 = memEq(auStack_548,poVar4,count);
      if (bVar2 == 0) {
        return 0;
      }
      memCopy(local_448,local_238,0x201);
      hexLower(local_448);
      hexUpper(local_448);
      iVar3 = strCmp(local_238,local_448);
      if (iVar3 != 0) {
        return 0;
      }
      count = count + 1;
      bVar2 = 1;
    } while (count != 0x101);
  }
  return bVar2;
}

Assistant:

bool_t hexTest()
{
	octet buf[256];
	char hex[512 + 1];
	char hex1[512 + 1];
	size_t count;
	// валидация
	if (!hexIsValid("1234") ||
		hexIsValid("12345") ||
		!hexIsValid("ABCDEFabcdef") ||
		hexIsValid("abcdefgh"))
		return FALSE;
	// кодировать / декодировать
	for (count = 0; count <= 256; ++count)
	{
		hexFrom(hex, beltH(), count);
		if (!hexEq(beltH(), hex))
			return FALSE;
		hexTo(buf, hex);
		if (!memEq(buf, beltH(), count))
			return FALSE;
		hexFromRev(hex, beltH(), count);
		if (!hexEqRev(beltH(), hex))
			return FALSE;
		hexToRev(buf, hex);
		if (!memEq(buf, beltH(), count))
			return FALSE;
		memCopy(hex1, hex, sizeof(hex));
		hexLower(hex1);
		hexUpper(hex1);
		if (!strEq(hex, hex1))
			return FALSE;
	}
	// все нормально
	return TRUE;
}